

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::copy_make_border_3d
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int front,int behind,
               int type,float v,Option *opt)

{
  Layer *pLVar1;
  ParamDict PStack_58;
  float local_44;
  Mat *local_40;
  Mat *local_38;
  
  local_44 = v;
  local_40 = src;
  local_38 = dst;
  pLVar1 = create_layer(0x2b);
  ParamDict::ParamDict(&PStack_58);
  ParamDict::set(&PStack_58,0,top);
  ParamDict::set(&PStack_58,1,bottom);
  ParamDict::set(&PStack_58,2,left);
  ParamDict::set(&PStack_58,3,right);
  ParamDict::set(&PStack_58,4,type);
  ParamDict::set(&PStack_58,5,local_44);
  ParamDict::set(&PStack_58,7,front);
  ParamDict::set(&PStack_58,8,behind);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&PStack_58);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,local_40,local_38,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&PStack_58);
  return;
}

Assistant:

void copy_make_border_3d(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int front, int behind, int type, float v, const Option& opt)
{
    Layer* padding = create_layer(LayerType::Padding);

    ParamDict pd;
    pd.set(0, top);
    pd.set(1, bottom);
    pd.set(2, left);
    pd.set(3, right);
    pd.set(4, type);
    pd.set(5, v);
    pd.set(7, front);
    pd.set(8, behind);

    padding->load_param(pd);

    padding->create_pipeline(opt);

    padding->forward(src, dst, opt);

    padding->destroy_pipeline(opt);

    delete padding;
}